

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

sysbvm_object_tuple_t * sysbvm_heap_allocatePointerTuple(sysbvm_heap_t *heap,size_t slotCount)

{
  sysbvm_object_tuple_t *result;
  size_t allocationSize;
  size_t objectSize;
  size_t slotCount_local;
  sysbvm_heap_t *heap_local;
  
  heap_local = (sysbvm_heap_t *)sysbvm_heap_allocateTupleWithRawSize(heap,slotCount * 8 + 0x18,0x10)
  ;
  if (heap_local == (sysbvm_heap_t *)0x0) {
    heap_local = (sysbvm_heap_t *)0x0;
  }
  else {
    *(uint32_t *)&heap_local->lastMallocObject = heap->gcWhiteColor;
    *(uint32_t *)((long)&heap_local->lastMallocObject + 4) = (uint32_t)(slotCount * 8);
  }
  return (sysbvm_object_tuple_t *)heap_local;
}

Assistant:

SYSBVM_API sysbvm_object_tuple_t *sysbvm_heap_allocatePointerTuple(sysbvm_heap_t *heap, size_t slotCount)
{
    size_t objectSize = slotCount*sizeof(sysbvm_object_tuple_t*);
    size_t allocationSize = sizeof(sysbvm_object_tuple_t) + objectSize;
    sysbvm_object_tuple_t *result = sysbvm_heap_allocateTupleWithRawSize(heap, allocationSize, 16);
    if(!result) return 0;

    result->header.identityHashAndFlags = (SYSBVM_TUPLE_OBJECT_KIND_POINTERS << SYSBVM_TUPLE_OBJECT_KIND_SHIFT) | (heap->gcWhiteColor << SYSBVM_TUPLE_GC_COLOR_SHIFT);
    result->header.objectSize = objectSize;
    return result;
}